

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool QDir::match(QStringList *filters,QString *fileName)

{
  QStringView pattern;
  bool bVar1;
  const_iterator o;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QRegularExpression rx;
  ConstIterator sit;
  WildcardConversionOption in_stack_ffffffffffffff6c;
  QList<QString> *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  byte in_stack_ffffffffffffff7f;
  QStringView *in_stack_ffffffffffffff80;
  CaseSensitivity in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QString *in_stack_ffffffffffffffc8;
  QRegularExpression *in_stack_ffffffffffffffd0;
  QFlagsStorage<QRegularExpression::WildcardConversionOption> in_stack_ffffffffffffffdc;
  qsizetype in_stack_ffffffffffffffe0;
  storage_type_conflict *psVar2;
  const_iterator local_10;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::constBegin(in_stack_ffffffffffffff70);
  while( true ) {
    o = QList<QString>::constEnd(in_stack_ffffffffffffff70);
    bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    psVar2 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::const_iterator::operator*(&local_10);
    QStringView::QStringView<QString,_true>
              (in_stack_ffffffffffffff80,
               (QString *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
    QFlags<QRegularExpression::WildcardConversionOption>::QFlags
              ((QFlags<QRegularExpression::WildcardConversionOption> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff80 = (QStringView *)&stack0xffffffffffffffe8;
    pattern.m_data = psVar2;
    pattern.m_size = in_stack_ffffffffffffffe0;
    QRegularExpression::fromWildcard
              (pattern,in_stack_ffffffffffffff9c,
               (WildcardConversionOptions)in_stack_ffffffffffffffdc.i);
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
    QRegularExpression::match
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (MatchType)((ulong)in_RDI >> 0x20),
               (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
               SUB84((ulong)lVar3 >> 0x20,0));
    in_stack_ffffffffffffff7f =
         QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x282357);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x282367);
    bVar1 = (in_stack_ffffffffffffff7f & 1) != 0;
    if (bVar1) {
      in_stack_ffffffffffffffc0 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x2823c7);
    if (bVar1) goto LAB_002823fb;
    QList<QString>::const_iterator::operator++(&local_10);
  }
  in_stack_ffffffffffffffc0 = 0;
LAB_002823fb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return (bool)((byte)((uint)in_stack_ffffffffffffffc0 >> 0x18) & 1);
}

Assistant:

bool QDir::match(const QStringList &filters, const QString &fileName)
{
    for (QStringList::ConstIterator sit = filters.constBegin(); sit != filters.constEnd(); ++sit) {
        // Insensitive exact match
        auto rx = QRegularExpression::fromWildcard(*sit, Qt::CaseInsensitive);
        if (rx.match(fileName).hasMatch())
            return true;
    }
    return false;
}